

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write.cpp
# Opt level: O2

bool check_string(string *stra)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  do {
    uVar4 = uVar3;
    uVar1 = stra->_M_string_length;
    if (uVar1 <= uVar4) break;
    pcVar2 = (char *)std::__cxx11::string::at((ulong)stra);
    uVar3 = uVar4 + 1;
  } while (*pcVar2 == ' ');
  return uVar4 < uVar1;
}

Assistant:

bool check_string(string stra)
{
	for (int i = 0; i < stra.length(); i++)
	{
		if (stra.at(i) != ' ')
		{
			return true;
		}
	}
	return false;
}